

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void inssort(uchar **a,int n,int d)

{
  uchar *puVar1;
  bool bVar2;
  uchar *tmp;
  uchar *t;
  uchar *s;
  uchar **pj;
  uchar **pi;
  int d_local;
  int n_local;
  uchar **a_local;
  
  pj = a + 1;
  pi._4_4_ = n;
  do {
    pi._4_4_ = pi._4_4_ + -1;
    if (pi._4_4_ < 1) {
      return;
    }
    puVar1 = *pj;
    for (s = (uchar *)pj; a < s; s = s + -8) {
      t = (uchar *)(*(long *)(s + -8) + (long)d);
      tmp = puVar1 + d;
      while( true ) {
        bVar2 = false;
        if (*t == *tmp) {
          bVar2 = *t != '\0';
        }
        if (!bVar2) break;
        t = t + 1;
        tmp = tmp + 1;
      }
      if (*t <= *tmp) break;
      *(undefined8 *)s = *(undefined8 *)(s + -8);
    }
    *(uchar **)s = puVar1;
    pj = pj + 1;
  } while( true );
}

Assistant:

void
inssort(unsigned char** a, int n, int d)
{
	unsigned char** pi;
	unsigned char** pj;
	unsigned char* s;
	unsigned char* t;

	for (pi = a + 1; --n > 0; pi++) {
		unsigned char* tmp = *pi;

		for (pj = pi; pj > a; pj--) {
			for (s=*(pj-1)+d, t=tmp+d; *s==*t && *s!=0; ++s, ++t)
				;
			if (*s <= *t)
				break;
			*pj = *(pj-1);
		}
		*pj = tmp;
	}
}